

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

void duckdb::ApproxQuantileListOperation<duckdb::dtime_tz_t>::
     Finalize<duckdb::list_entry_t,duckdb::ApproxQuantileState>
               (ApproxQuantileState *state,list_entry_t *target,AggregateFinalizeData *finalize_data
               )

{
  ApproximateQuantileBindData *pAVar1;
  Value q_00;
  Value VVar2;
  undefined8 *in_RDX;
  Value *in_RSI;
  long in_RDI;
  dtime_tz_t *target_1;
  Value *source;
  value_type *quantile;
  size_t q;
  list_entry_t *entry;
  dtime_tz_t *rdata;
  idx_t ridx;
  Vector *result;
  ApproximateQuantileBindData *bind_data;
  dtime_tz_t *in_stack_00000098;
  double *in_stack_000000a0;
  Vector *in_stack_ffffffffffffff88;
  FunctionData *in_stack_ffffffffffffff90;
  TDigest *this;
  Value local_60;
  Value *local_58;
  reference local_50;
  Value local_48;
  Value *local_40;
  dtime_tz_t *local_38;
  AggregateFinalizeData *in_stack_ffffffffffffffd0;
  
  if (*(long *)(in_RDI + 8) == 0) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffffd0);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffff90);
    pAVar1 = FunctionData::Cast<duckdb::ApproximateQuantileBindData>(in_stack_ffffffffffffff90);
    ListVector::GetEntry((Vector *)0x1de02f6);
    q_00 = (Value)ListVector::GetListSize(in_stack_ffffffffffffff88);
    this = (TDigest *)*in_RDX;
    VVar2 = q_00;
    ::std::vector<float,_std::allocator<float>_>::size
              (&(pAVar1->quantiles).super_vector<float,_std::allocator<float>_>);
    ListVector::Reserve((Vector *)this,(idx_t)q_00);
    local_38 = FlatVector::GetData<duckdb::dtime_tz_t>((Vector *)0x1de034c);
    duckdb_tdigest::TDigest::compress((TDigest *)0x1de035e);
    *in_RSI = VVar2;
    local_40 = in_RSI;
    VVar2 = (Value)::std::vector<float,_std::allocator<float>_>::size
                             (&(pAVar1->quantiles).super_vector<float,_std::allocator<float>_>);
    local_40[1] = VVar2;
    for (local_48 = 0.0; (ulong)local_48 < (ulong)local_40[1];
        local_48 = (Value)((long)local_48 + 1)) {
      local_50 = vector<float,_true>::operator[]((vector<float,_true> *)this,(size_type)q_00);
      local_60 = duckdb_tdigest::TDigest::quantile(this,q_00);
      local_58 = &local_60;
      ApproxQuantileCoding::Decode<double,duckdb::dtime_tz_t>(in_stack_000000a0,in_stack_00000098);
    }
    ListVector::SetListSize((Vector *)this,(idx_t)q_00);
  }
  return;
}

Assistant:

static void Finalize(STATE &state, RESULT_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ApproximateQuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		D_ASSERT(state.h);
		state.h->compress();

		auto &entry = target;
		entry.offset = ridx;
		entry.length = bind_data.quantiles.size();
		for (size_t q = 0; q < entry.length; ++q) {
			const auto &quantile = bind_data.quantiles[q];
			const auto &source = state.h->quantile(quantile);
			auto &target = rdata[ridx + q];
			ApproxQuantileCoding::Decode(source, target);
		}

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}